

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DefaultApu.cpp
# Opt level: O1

void __thiscall trackerboy::DefaultApu::Private::Private(Private *this)

{
  this->mNr51 = '\0';
  this->mLeftVolume = '\x01';
  this->mRightVolume = '\x01';
  apu::Mixer::Mixer(&this->mMixer);
  apu::Hardware::Hardware(&this->mHardware);
  this->mCycletime = 0;
  this->mEnabled = false;
  this->mVolumeStep = 0.0020833334;
  apu::Mixer::setVolume
            (&this->mMixer,(float)this->mLeftVolume * 0.0020833334,
             (float)this->mRightVolume * 0.0020833334);
  return;
}

Assistant:

Private() :
        mNr51(0),
        mLeftVolume(1),
        mRightVolume(1),
        mMixer(),
        mHardware(),
        mCycletime(0),
        mEnabled(false),
        mVolumeStep(0.0f)
    {
        setVolume(1.0f);
    }